

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  Disposer *disposerCopy;
  long *pointer;
  long *pointer_00;
  Nested *ptrCopy_1;
  char *this_00;
  Nested *ptrCopy;
  bool destroyed2;
  bool destroyed1;
  char local_1a;
  char local_19;
  
  local_19 = '\0';
  local_1a = '\0';
  pointer = (long *)operator_new(0x18);
  *pointer = (long)&local_19;
  pointer[1] = 0;
  pointer[2] = 0;
  this_00 = (char *)0x18;
  pointer_00 = (long *)operator_new(0x18);
  *pointer_00 = (long)&local_1a;
  pointer_00[1] = 0;
  pointer_00[2] = 0;
  pointer[1] = (long)&_::HeapDisposer<kj::(anonymous_namespace)::Nested>::instance;
  pointer[2] = 0;
  _::HeapDisposer<kj::(anonymous_namespace)::Nested>::disposeImpl
            ((HeapDisposer<kj::(anonymous_namespace)::Nested> *)this_00,pointer);
  if (_::Debug::minSeverity < 3 && local_19 == '\0') {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
    ;
    _::Debug::log<char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"destroyed1\"",
               (char (*) [28])"failed: expected destroyed1");
  }
  if ((local_1a == '\x01') && (_::Debug::minSeverity < 3)) {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
    ;
    _::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x3f,ERROR,"\"failed: expected \" \"!(destroyed2)\"",
               (char (*) [31])"failed: expected !(destroyed2)");
  }
  _::HeapDisposer<kj::(anonymous_namespace)::Nested>::disposeImpl
            ((HeapDisposer<kj::(anonymous_namespace)::Nested> *)this_00,pointer_00);
  if (((local_19 != '\x01') || (local_1a == '\0')) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"destroyed1 && destroyed2\"",
               (char (*) [42])"failed: expected destroyed1 && destroyed2");
  }
  return;
}

Assistant:

TEST(Memory, AssignNested) {
  bool destroyed1 = false, destroyed2 = false;
  auto nested = heap<Nested>(destroyed1);
  nested->nested = heap<Nested>(destroyed2);
  EXPECT_FALSE(destroyed1 || destroyed2);
  nested = kj::mv(nested->nested);
  EXPECT_TRUE(destroyed1);
  EXPECT_FALSE(destroyed2);
  nested = nullptr;
  EXPECT_TRUE(destroyed1 && destroyed2);
}